

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# luckyFast16.c
# Opt level: O1

int minimalSwapAndFlipIVar_superFast_all_noEBFC
              (word *pInOut,int nVars,int nWords,int *pStore,char *pCanonPerm,uint *pCanonPhase)

{
  int iVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  word pDuplicate [1024];
  undefined1 local_2038 [8200];
  
  iVar1 = *pStore;
  memcpy(local_2038,pInOut,(long)nWords << 3);
  lVar3 = 0;
  do {
    iVar2 = pStore[lVar3 + 1];
    if (iVar1 == pStore[lVar3 + 1]) {
      minimalSwapAndFlipIVar_superFast_lessThen5_noEBFC
                (pInOut,(int)lVar3,nWords,pCanonPerm,pCanonPhase);
      iVar2 = iVar1;
    }
    iVar1 = iVar2;
    lVar3 = lVar3 + 1;
  } while (lVar3 != 5);
  iVar2 = pStore[6];
  if (iVar1 == pStore[6]) {
    minimalSwapAndFlipIVar_superFast_iVar5_noEBFC((uint *)pInOut,nWords,pCanonPerm,pCanonPhase);
    iVar2 = iVar1;
  }
  if (7 < nVars) {
    uVar4 = 6;
    do {
      iVar1 = pStore[uVar4 + 1];
      if (iVar2 == pStore[uVar4 + 1]) {
        minimalSwapAndFlipIVar_superFast_moreThen5_noEBFC
                  (pInOut,(int)uVar4,nWords,pCanonPerm,pCanonPhase);
        iVar1 = iVar2;
      }
      iVar2 = iVar1;
      uVar4 = uVar4 + 1;
    } while (nVars - 1 != uVar4);
  }
  iVar1 = bcmp(pInOut,local_2038,(long)nWords << 3);
  return (int)(iVar1 != 0);
}

Assistant:

int minimalSwapAndFlipIVar_superFast_all_noEBFC(word* pInOut, int nVars, int nWords, int * pStore, char * pCanonPerm, unsigned* pCanonPhase)
{
    int i;
    word pDuplicate[1024];  
    int bitInfoTemp = pStore[0];
    memcpy(pDuplicate,pInOut,nWords*sizeof(word));
    for(i=0;i<5;i++)
    {
        if(bitInfoTemp == pStore[i+1])
            minimalSwapAndFlipIVar_superFast_lessThen5_noEBFC(pInOut, i, nWords, pCanonPerm, pCanonPhase);
        else
        {
            bitInfoTemp = pStore[i+1];
            continue;
        }
    }
    if(bitInfoTemp == pStore[i+1])
        minimalSwapAndFlipIVar_superFast_iVar5_noEBFC((unsigned*) pInOut, nWords, pCanonPerm, pCanonPhase);
    else    
        bitInfoTemp = pStore[i+1];
    
    for(i=6;i<nVars-1;i++)
    {
        if(bitInfoTemp == pStore[i+1])
            minimalSwapAndFlipIVar_superFast_moreThen5_noEBFC(pInOut, i, nWords, pCanonPerm, pCanonPhase);
        else
        {
            bitInfoTemp = pStore[i+1];
            continue;
        }
    }
    if(memcmp(pInOut,pDuplicate , nWords*sizeof(word)) == 0)
        return 0;
    else
        return 1;
}